

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void __thiscall embree::Tutorial::postParseCommandLine(Tutorial *this)

{
  bool bVar1;
  ParseStream *this_00;
  LineCommentFilter *this_01;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  Ref<embree::Stream<int>_> local_d8;
  Ref<embree::ParseStream> local_d0;
  string local_c8;
  string local_a8;
  FileName file;
  FileName local_68;
  string local_48;
  
  if ((ulong)shader < 0xb) {
    renderFrame = (&PTR_renderFrameStandard_002a7ec8)[shader];
  }
  bVar1 = SceneLoadingTutorialApplication::scene_empty_post_parse
                    (&this->super_SceneLoadingTutorialApplication);
  if (bVar1) {
    FileName::executableFolder();
    FileName::FileName((FileName *)&local_c8,"models/cornell_box.ecs");
    FileName::operator+(&file,(FileName *)&local_a8,(FileName *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = (ParseStream *)::operator_new(0x48);
    this_01 = (LineCommentFilter *)::operator_new(0x68);
    std::__cxx11::string::string((string *)&local_a8,"#",&local_d9);
    LineCommentFilter::LineCommentFilter(this_01,&file,&local_a8);
    local_d8.ptr = (Stream<int> *)this_01;
    (*(this_01->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_01);
    std::__cxx11::string::string((string *)&local_c8,"\n\t\r ",&local_da);
    std::__cxx11::string::string((string *)&local_48,"",&local_db);
    ParseStream::ParseStream(this_00,&local_d8,&local_c8,&local_48,false);
    local_d0.ptr = this_00;
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
    FileName::path(&local_68,&file);
    Application::parseCommandLine((Application *)this,&local_d0,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_d0.ptr != (ParseStream *)0x0) {
      (*((local_d0.ptr)->
        super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super_RefCount._vptr_RefCount[3])();
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
    if ((LineCommentFilter *)local_d8.ptr != (LineCommentFilter *)0x0) {
      (*(((Stream<int> *)&(local_d8.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&file);
  }
  return;
}

Assistant:

void postParseCommandLine() override
    {
      /* set shader mode */
      switch (shader) {
      case SHADER_DEFAULT  : renderFrame = renderFrameStandard; break;
      case SHADER_EYELIGHT : renderFrame = renderFrameDebugShader; break;
      case SHADER_OCCLUSION: renderFrame = renderFrameDebugShader; break;
      case SHADER_UV       : renderFrame = renderFrameDebugShader; break;
      case SHADER_TEXCOORDS: renderFrame = renderFrameDebugShader; break;
      case SHADER_TEXCOORDS_GRID: renderFrame = renderFrameDebugShader; break;
      case SHADER_NG       : renderFrame = renderFrameDebugShader; break;
      case SHADER_CYCLES   : renderFrame = renderFrameDebugShader; break;
      case SHADER_GEOMID   : renderFrame = renderFrameDebugShader; break;
      case SHADER_GEOMID_PRIMID: renderFrame = renderFrameDebugShader; break;
      case SHADER_AO: renderFrame = renderFrameAOShader; break;      
      };
      
      /* load default scene if none specified */
      if (scene_empty_post_parse()) {
        FileName file = FileName::executableFolder() + FileName("models/cornell_box.ecs");
        parseCommandLine(new ParseStream(new LineCommentFilter(file, "#")), file.path());
      }
    }